

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall google::protobuf::compiler::Parser::ParseLabel(Parser *this,Label *label)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  Label *local_20;
  Label *label_local;
  Parser *this_local;
  
  local_20 = label;
  label_local = (Label *)this;
  bVar1 = TryConsume(this,"optional");
  if (bVar1) {
    *local_20 = FieldDescriptorProto_Label_LABEL_OPTIONAL;
  }
  else {
    bVar1 = TryConsume(this,"repeated");
    if (bVar1) {
      *local_20 = FieldDescriptorProto_Label_LABEL_REPEATED;
    }
    else {
      bVar1 = TryConsume(this,"required");
      if (bVar1) {
        *local_20 = FieldDescriptorProto_Label_LABEL_REQUIRED;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Expected \"required\", \"optional\", or \"repeated\".",
                   &local_41);
        AddError(this,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator(&local_41);
        *local_20 = FieldDescriptorProto_Label_LABEL_OPTIONAL;
      }
    }
  }
  return true;
}

Assistant:

bool Parser::ParseLabel(FieldDescriptorProto::Label* label) {
  if (TryConsume("optional")) {
    *label = FieldDescriptorProto::LABEL_OPTIONAL;
    return true;
  } else if (TryConsume("repeated")) {
    *label = FieldDescriptorProto::LABEL_REPEATED;
    return true;
  } else if (TryConsume("required")) {
    *label = FieldDescriptorProto::LABEL_REQUIRED;
    return true;
  } else {
    AddError("Expected \"required\", \"optional\", or \"repeated\".");
    // We can actually reasonably recover here by just assuming the user
    // forgot the label altogether.
    *label = FieldDescriptorProto::LABEL_OPTIONAL;
    return true;
  }
}